

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

void XXH3_scrambleAcc_sse2(void *acc,void *secret)

{
  long lVar1;
  uint uVar3;
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 0x10) {
    auVar4 = *(undefined1 (*) [16])((long)acc + lVar1);
    auVar2._0_8_ = auVar4._0_8_ >> 0x2f;
    auVar2._8_8_ = auVar4._8_8_ >> 0x2f;
    auVar2 = auVar2 ^ *(undefined1 (*) [16])((long)secret + lVar1) ^ auVar4;
    uVar3 = auVar2._4_4_;
    auVar4._4_4_ = uVar3;
    auVar4._0_4_ = uVar3;
    auVar4._8_4_ = auVar2._12_4_;
    auVar4._12_4_ = auVar2._12_4_;
    *(long *)((long)acc + lVar1) =
         ((ulong)uVar3 * 0x9e3779b1 << 0x20) + (ulong)auVar2._0_4_ * 0x9e3779b1;
    ((long *)((long)acc + lVar1))[1] =
         ((auVar4._8_8_ & 0xffffffff) * 0x9e3779b1 << 0x20) +
         (auVar2._8_8_ & 0xffffffff) * 0x9e3779b1;
  }
  return;
}

Assistant:

XXH_FORCE_INLINE XXH_TARGET_SSE2 void XXH3_scrambleAcc_sse2(
    void* XXH_RESTRICT acc, const void* XXH_RESTRICT secret) {
  XXH_ASSERT((((size_t)acc) & 15) == 0);
  {
    XXH_ALIGN(16) __m128i* const xacc = (__m128i*)acc;
    /* Unaligned. This is mainly for pointer arithmetic, and because
     * _mm_loadu_si128 requires a const __m128i * pointer for some reason. */
    const __m128i* const xsecret = (const __m128i*)secret;
    const __m128i prime32 = _mm_set1_epi32((int)XXH_PRIME32_1);

    size_t i;
    for (i = 0; i < XXH_STRIPE_LEN / sizeof(__m128i); i++) {
      /* xacc[i] ^= (xacc[i] >> 47) */
      __m128i const acc_vec = xacc[i];
      __m128i const shifted = _mm_srli_epi64(acc_vec, 47);
      __m128i const data_vec = _mm_xor_si128(acc_vec, shifted);
      /* xacc[i] ^= xsecret[i]; */
      __m128i const key_vec = _mm_loadu_si128(xsecret + i);
      __m128i const data_key = _mm_xor_si128(data_vec, key_vec);

      /* xacc[i] *= XXH_PRIME32_1; */
      __m128i const data_key_hi =
          _mm_shuffle_epi32(data_key, _MM_SHUFFLE(0, 3, 0, 1));
      __m128i const prod_lo = _mm_mul_epu32(data_key, prime32);
      __m128i const prod_hi = _mm_mul_epu32(data_key_hi, prime32);
      xacc[i] = _mm_add_epi64(prod_lo, _mm_slli_epi64(prod_hi, 32));
    }
  }
}